

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<const_void_*,_QCss::StyleSheet>::emplace_helper<QCss::StyleSheet>
          (QHash<const_void_*,_QCss::StyleSheet> *this,void **key,StyleSheet *args)

{
  piter pVar1;
  Node<const_void_*,_QCss::StyleSheet> *n;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>>::findOrInsert<void_const*>
            ((InsertionResult *)local_38,
             (Data<QHashPrivate::Node<void_const*,QCss::StyleSheet>> *)this->d,key);
  n = (Node<const_void_*,_QCss::StyleSheet> *)
      ((*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries +
      (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
      [(uint)local_38._8_8_ & 0x7f]);
  if (local_38[0x10] == false) {
    QHashPrivate::Node<const_void_*,_QCss::StyleSheet>::createInPlace<QCss::StyleSheet>(n,key,args);
  }
  else {
    QHashPrivate::Node<const_void_*,_QCss::StyleSheet>::emplaceValue<QCss::StyleSheet>(n,args);
  }
  pVar1.bucket = local_38._8_8_;
  pVar1.d = (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }